

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O2

void fpconv_init(void)

{
  char buf [8];
  
  snprintf(buf,8,"%g",0x3fe0000000000000);
  if (((buf[0] == '0') && (buf[2] == '5')) && (buf[3] == '\0')) {
    locale_decimal_point = buf[1];
    return;
  }
  fwrite("Error: wide characters found or printf() bug.",0x2d,1,_stderr);
  abort();
}

Assistant:

static void fpconv_update_locale()
{
    char buf[8];

    snprintf(buf, sizeof(buf), "%g", 0.5);

    /* Failing this test might imply the platform has a buggy dtoa
     * implementation or wide characters */
    if (buf[0] != '0' || buf[2] != '5' || buf[3] != 0) {
        fprintf(stderr, "Error: wide characters found or printf() bug.");
        abort();
    }

    locale_decimal_point = buf[1];
}